

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pointer __thiscall
google::protobuf::internal::
MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::Node>
::allocate(MapAllocator<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::Node>
           *this,size_type n,void *param_2)

{
  pointer pvVar1;
  
  if (this->arena_ == (Arena *)0x0) {
    pvVar1 = (pointer)operator_new(n * 0x48);
    return pvVar1;
  }
  pvVar1 = (pointer)Arena::AllocateAlignedWithHook
                              (this->arena_,n * 0x48,1,(type_info *)&unsigned_char::typeinfo);
  return pvVar1;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = nullptr) {
    // If arena is not given, malloc needs to be called which doesn't
    // construct element object.
    if (arena_ == nullptr) {
      return static_cast<pointer>(::operator new(n * sizeof(value_type)));
    } else {
      return reinterpret_cast<pointer>(
          Arena::CreateArray<uint8_t>(arena_, n * sizeof(value_type)));
    }
  }